

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O0

bool __thiscall ON_BrepRegionTopology::Read(ON_BrepRegionTopology *this,ON_BinaryArchive *file)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ON_BrepFaceSide *pOVar4;
  ON_BrepRegion *pOVar5;
  bool local_2d;
  int local_2c;
  int iStack_28;
  bool rc;
  int minor_version;
  int major_version;
  int i;
  ON_BinaryArchive *file_local;
  ON_BrepRegionTopology *this_local;
  
  iStack_28 = 0;
  local_2c = 0;
  _major_version = file;
  file_local = (ON_BinaryArchive *)this;
  bVar2 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&stack0xffffffffffffffd8,&local_2c);
  if (bVar2) {
    local_2d = iStack_28 == 1;
    if (local_2d) {
      local_2d = ON_BrepFaceSideArray::Read(&this->m_FS,_major_version);
      for (minor_version = 0; iVar1 = minor_version,
          iVar3 = ON_ClassArray<ON_BrepFaceSide>::Count((ON_ClassArray<ON_BrepFaceSide> *)this),
          iVar1 < iVar3; minor_version = minor_version + 1) {
        pOVar4 = ON_ClassArray<ON_BrepFaceSide>::operator[]
                           ((ON_ClassArray<ON_BrepFaceSide> *)this,minor_version);
        pOVar4->m_rtop = this;
      }
      if (local_2d) {
        local_2d = ON_BrepRegionArray::Read(&this->m_R,_major_version);
        for (minor_version = 0; iVar1 = minor_version,
            iVar3 = ON_ClassArray<ON_BrepRegion>::Count((ON_ClassArray<ON_BrepRegion> *)&this->m_R),
            iVar1 < iVar3; minor_version = minor_version + 1) {
          pOVar5 = ON_ClassArray<ON_BrepRegion>::operator[]
                             ((ON_ClassArray<ON_BrepRegion> *)&this->m_R,minor_version);
          pOVar5->m_rtop = this;
        }
      }
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(_major_version);
    if (!bVar2) {
      local_2d = false;
    }
    this_local._7_1_ = local_2d;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BrepRegionTopology::Read( ON_BinaryArchive& file )
{
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if ( !rc )
    return false;
  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = m_FS.Read(file);
    for ( i = 0; i < m_FS.Count(); i++ )
      m_FS[i].m_rtop = this;
    if (!rc) break;

    rc = m_R.Read(file);
    for ( i = 0; i < m_R.Count(); i++ )
      m_R[i].m_rtop = this;
    if (!rc) break;

    break;
  }
  if ( !file.EndRead3dmChunk() )
    rc = false;
  return rc;
}